

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibs,string *flags,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkFlags,string *frameworkPath,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkPath,cmGeneratorTarget *target)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  string *psVar6;
  cmValue cVar7;
  undefined8 *puVar8;
  pointer pcVar9;
  char *pcVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  string extraLinkFlags;
  string exeFlags;
  string linkLanguage;
  string build;
  string configUpper;
  string local_148;
  undefined1 local_128 [32];
  pointer local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  string local_f8;
  string local_c8;
  cmComputeLinkInformation *local_a8;
  cmLinkLineComputer *local_a0;
  string local_98;
  string local_78;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_58;
  string local_50;
  
  local_58 = linkLibs;
  cmsys::SystemTools::UpperCase(&local_78,config);
  local_a8 = cmGeneratorTarget::GetLinkInformation(target,config);
  local_a0 = linkLineComputer;
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(&local_c8,linkLineComputer,target,config);
  TVar4 = cmGeneratorTarget::GetType(target);
  switch(TVar4) {
  case EXECUTABLE:
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity =
         local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    iVar5 = std::__cxx11::string::compare((char *)&local_c8);
    if (iVar5 == 0) {
LAB_0027798a:
      AddLanguageFlagsForLinking(this,flags,target,&local_c8,config);
      if (local_a8 != (cmComputeLinkInformation *)0x0) {
        OutputLinkLibraries(this,local_a8,local_a0,local_58,frameworkPath,linkPath);
      }
      pcVar2 = this->Makefile;
      pcVar1 = local_128 + 0x10;
      local_128._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"BUILD_SHARED_LIBS","");
      bVar3 = cmMakefile::IsOn(pcVar2,(string *)local_128);
      if ((pointer)local_128._0_8_ != pcVar1) {
        operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
      }
      if (bVar3) {
        std::operator+(&local_148,"CMAKE_SHARED_BUILD_",&local_c8);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        pcVar9 = (pointer)(puVar8 + 2);
        if ((pointer)*puVar8 == pcVar9) {
          local_128._16_8_ = *(undefined8 *)pcVar9;
          local_128._24_8_ = puVar8[3];
          local_128._0_8_ = pcVar1;
        }
        else {
          local_128._16_8_ = *(undefined8 *)pcVar9;
          local_128._0_8_ = (pointer)*puVar8;
        }
        local_128._8_8_ = puVar8[1];
        *puVar8 = pcVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        psVar6 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_128);
        std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(psVar6->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_f8);
        if ((pointer)local_128._0_8_ != pcVar1) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
        }
      }
      GetLinkLibsCMP0065(&local_148,this,&local_c8,target);
      if (local_148._M_string_length != 0) {
        std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_148._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_f8);
      }
      local_128._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"LINK_FLAGS","");
      cVar7 = cmGeneratorTarget::GetProperty(target,(string *)local_128);
      if ((pointer)local_128._0_8_ != pcVar1) {
        operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
      }
      if (cVar7.Value != (string *)0x0) {
        std::__cxx11::string::_M_append((char *)&local_f8,(ulong)((cVar7.Value)->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_f8);
      }
      if ((pointer)local_78._M_string_length != (pointer)0x0) {
        local_128._0_8_ = (pointer)0xb;
        local_128._8_8_ = "LINK_FLAGS_";
        local_128._16_8_ = local_78._M_string_length;
        local_128._24_8_ = local_78._M_dataplus._M_p;
        views_06._M_len = 2;
        views_06._M_array = (iterator)local_128;
        cmCatViews_abi_cxx11_(&local_98,views_06);
        cVar7 = cmGeneratorTarget::GetProperty(target,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (cVar7.Value != (string *)0x0) {
          std::__cxx11::string::_M_append
                    ((char *)&local_f8,(ulong)((cVar7.Value)->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_f8);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   linkFlags,&local_f8);
      }
      cmGeneratorTarget::GetLinkOptions
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_128,target,config,&local_c8);
      AppendCompileOptions
                (this,linkFlags,
                 (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_128,(char *)0x0);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                 local_148.field_2._M_local_buf[0]) + 1);
      }
      uVar11 = local_f8.field_2._M_allocated_capacity;
      _Var12._M_p = local_f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == &local_f8.field_2) break;
      goto LAB_00277cc1;
    }
    pcVar2 = this->Makefile;
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CMAKE_EXE_LINKER_FLAGS","")
    ;
    cmMakefile::GetSafeDefinition(pcVar2,(string *)local_128);
    std::__cxx11::string::_M_assign((string *)&local_f8);
    if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
    }
    std::__cxx11::string::append((char *)&local_f8);
    if ((pointer)local_78._M_string_length != (pointer)0x0) {
      pcVar2 = this->Makefile;
      local_128._0_8_ = (pointer)0x17;
      local_128._8_8_ = "CMAKE_EXE_LINKER_FLAGS_";
      local_128._16_8_ = local_78._M_string_length;
      local_128._24_8_ = local_78._M_dataplus._M_p;
      views._M_len = 2;
      views._M_array = (iterator)local_128;
      cmCatViews_abi_cxx11_(&local_148,views);
      psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_148);
      std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(psVar6->_M_dataplus)._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                 local_148.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::append((char *)&local_f8);
    }
    if ((pointer)local_c8._M_string_length != (pointer)0x0) {
      bVar3 = cmGeneratorTarget::IsWin32Executable(target,config);
      pcVar2 = this->Makefile;
      if (bVar3) {
        local_128._0_8_ = (pointer)0x6;
        local_128._8_8_ = "CMAKE_";
        local_128._16_8_ = local_c8._M_string_length;
        local_128._24_8_ = local_c8._M_dataplus._M_p;
        local_108 = (pointer)&DAT_00000011;
        local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x755aed;
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_128;
        cmCatViews_abi_cxx11_(&local_148,views_00);
        psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_148);
        std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(psVar6->_M_dataplus)._M_p);
      }
      else {
        local_128._0_8_ = (pointer)0x6;
        local_128._8_8_ = "CMAKE_";
        local_128._16_8_ = local_c8._M_string_length;
        local_128._24_8_ = local_c8._M_dataplus._M_p;
        local_108 = (pointer)0x13;
        local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x755aff;
        views_04._M_len = 3;
        views_04._M_array = (iterator)local_128;
        cmCatViews_abi_cxx11_(&local_148,views_04);
        psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_148);
        std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(psVar6->_M_dataplus)._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                 local_148.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::append((char *)&local_f8);
      bVar3 = cmGeneratorTarget::IsExecutableWithExports(target);
      if (bVar3) {
        pcVar2 = this->Makefile;
        local_128._0_8_ = (pointer)0x12;
        local_128._8_8_ = "CMAKE_EXE_EXPORTS_";
        local_128._16_8_ = local_c8._M_string_length;
        local_128._24_8_ = local_c8._M_dataplus._M_p;
        local_108 = (pointer)0x5;
        local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x77fdb0;
        views_05._M_len = 3;
        views_05._M_array = (iterator)local_128;
        cmCatViews_abi_cxx11_(&local_148,views_05);
        psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_148);
        std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(psVar6->_M_dataplus)._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::string::append((char *)&local_f8);
      }
      goto LAB_0027798a;
    }
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   "CMake can not determine linker language for target: ",psVar6);
    cmSystemTools::Error((string *)local_128);
    if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
    }
    uVar11 = local_f8.field_2._M_allocated_capacity;
    _Var12._M_p = local_f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_00277d5a;
    goto LAB_00277d52;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_f8,this,config,&local_c8,target);
    local_128._16_8_ =
         (linkFlags->
         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (linkFlags->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_f8.field_2._M_allocated_capacity;
    local_128._0_8_ =
         (linkFlags->
         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_128._8_8_ =
         (linkFlags->
         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    (linkFlags->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8._M_dataplus._M_p;
    (linkFlags->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f8._M_string_length;
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_128);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_f8);
    break;
  case SHARED_LIBRARY:
    pcVar10 = "CMAKE_SHARED_LINKER_FLAGS";
    goto LAB_0027743e;
  case MODULE_LIBRARY:
    pcVar10 = "CMAKE_MODULE_LINKER_FLAGS";
LAB_0027743e:
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    local_148._M_string_length = 0;
    local_148.field_2._M_local_buf[0] = '\0';
    iVar5 = std::__cxx11::string::compare((char *)&local_c8);
    if (iVar5 != 0) {
      pcVar2 = this->Makefile;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar10,
                 (undefined1 *)((long)&(((pointer)pcVar10)->Value).field_2 + 9));
      psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_50);
      local_f8._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
      local_f8._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
      local_128._8_8_ = local_128 + 0x10;
      local_128._0_8_ = (pointer)0x1;
      local_128[0x10] = 0x20;
      local_f8.field_2._M_allocated_capacity = 1;
      views_01._M_len = 2;
      views_01._M_array = (iterator)&local_f8;
      local_f8.field_2._8_8_ = local_128._8_8_;
      cmCatViews_abi_cxx11_(&local_98,views_01);
      std::__cxx11::string::operator=((string *)&local_148,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_78._M_string_length != (pointer)0x0) {
        local_128._24_8_ = &local_f8.field_2;
        local_f8._M_dataplus._M_p = (pointer)0x1;
        local_f8.field_2._M_local_buf[0] = 0x5f;
        local_128._0_8_ = (pointer)0x19;
        local_128._16_8_ = (pointer)0x1;
        local_108 = (pointer)local_78._M_string_length;
        local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p;
        views_02._M_len = 3;
        views_02._M_array = (iterator)local_128;
        local_128._8_8_ = pcVar10;
        local_f8._M_string_length = local_128._24_8_;
        cmCatViews_abi_cxx11_(&local_98,views_02);
        psVar6 = cmMakefile::GetSafeDefinition(this->Makefile,&local_98);
        std::__cxx11::string::_M_append((char *)&local_148,(ulong)(psVar6->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"LINK_FLAGS","");
    cVar7 = cmGeneratorTarget::GetProperty(target,(string *)local_128);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
    }
    if (cVar7.Value != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)&local_148,(ulong)((cVar7.Value)->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_148);
    }
    if ((pointer)local_78._M_string_length != (pointer)0x0) {
      local_128._0_8_ = (pointer)0xb;
      local_128._8_8_ = "LINK_FLAGS_";
      local_128._16_8_ = local_78._M_string_length;
      local_128._24_8_ = local_78._M_dataplus._M_p;
      views_03._M_len = 2;
      views_03._M_array = (iterator)local_128;
      cmCatViews_abi_cxx11_(&local_f8,views_03);
      cVar7 = cmGeneratorTarget::GetProperty(target,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
      if (cVar7.Value != (string *)0x0) {
        std::__cxx11::string::_M_append((char *)&local_148,(ulong)((cVar7.Value)->_M_dataplus)._M_p)
        ;
        std::__cxx11::string::append((char *)&local_148);
      }
    }
    if (local_148._M_string_length != 0) {
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 linkFlags,&local_148);
    }
    cmGeneratorTarget::GetLinkOptions
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_128,target,config,&local_c8);
    AppendCompileOptions
              (this,linkFlags,
               (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_128,(char *)0x0);
    if (local_a8 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,local_a8,local_a0,local_58,frameworkPath,linkPath);
    }
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      uVar11 = (pointer)CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                 local_148.field_2._M_local_buf[0]);
      _Var12._M_p = local_148._M_dataplus._M_p;
LAB_00277cc1:
      operator_delete(_Var12._M_p,(ulong)((long)&(((pointer)uVar11)->Value)._M_dataplus._M_p + 1));
    }
  }
  local_128._8_8_ = (pointer)0x0;
  local_128._16_8_ = local_128._16_8_ & 0xffffffffffffff00;
  local_128._0_8_ = (pointer)(local_128 + 0x10);
  AppendPositionIndependentLinkerFlags(this,(string *)local_128,target,config,&local_c8);
  AppendIPOLinkerFlags(this,(string *)local_128,target,config,&local_c8);
  AppendModuleDefinitionFlag(this,(string *)local_128,target,local_a0,config);
  if ((pointer)local_128._8_8_ != (pointer)0x0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               linkFlags,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  }
  uVar11 = local_128._16_8_;
  _Var12._M_p = (pointer)local_128._0_8_;
  if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x10)) {
LAB_00277d52:
    operator_delete(_Var12._M_p,(ulong)((long)&(((pointer)uVar11)->Value)._M_dataplus._M_p + 1));
  }
LAB_00277d5a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::vector<BT<std::string>>& linkLibs, std::string& flags,
  std::vector<BT<std::string>>& linkFlags, std::string& frameworkPath,
  std::vector<BT<std::string>>& linkPath, cmGeneratorTarget* target)
{
  const std::string configUpper = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, config);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      linkFlags = this->GetStaticLibraryFlags(config, linkLanguage, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      std::string sharedLibFlags;
      if (linkLanguage != "Swift") {
        sharedLibFlags = cmStrCat(
          this->Makefile->GetSafeDefinition(libraryLinkVariable), ' ');
        if (!configUpper.empty()) {
          std::string build = cmStrCat(libraryLinkVariable, '_', configUpper);
          sharedLibFlags += this->Makefile->GetSafeDefinition(build);
          sharedLibFlags += " ";
        }
      }

      cmValue targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        sharedLibFlags += *targetLinkFlags;
        sharedLibFlags += " ";
      }
      if (!configUpper.empty()) {
        targetLinkFlags =
          target->GetProperty(cmStrCat("LINK_FLAGS_", configUpper));
        if (targetLinkFlags) {
          sharedLibFlags += *targetLinkFlags;
          sharedLibFlags += " ";
        }
      }

      if (!sharedLibFlags.empty()) {
        linkFlags.emplace_back(std::move(sharedLibFlags));
      }

      std::vector<BT<std::string>> linkOpts =
        target->GetLinkOptions(config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, linkOpts);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      std::string exeFlags;
      if (linkLanguage != "Swift") {
        exeFlags = this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
        exeFlags += " ";
        if (!configUpper.empty()) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_EXE_LINKER_FLAGS_", configUpper));
          exeFlags += " ";
        }
        if (linkLanguage.empty()) {
          cmSystemTools::Error(
            "CMake can not determine linker language for target: " +
            target->GetName());
          return;
        }

        if (target->IsWin32Executable(config)) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_", linkLanguage, "_CREATE_WIN32_EXE"));
          exeFlags += " ";
        } else {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_", linkLanguage, "_CREATE_CONSOLE_EXE"));
          exeFlags += " ";
        }

        if (target->IsExecutableWithExports()) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_EXE_EXPORTS_", linkLanguage, "_FLAG"));
          exeFlags += " ";
        }
      }

      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, config);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }

      if (this->Makefile->IsOn("BUILD_SHARED_LIBS")) {
        std::string sFlagVar = "CMAKE_SHARED_BUILD_" + linkLanguage + "_FLAGS";
        exeFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        exeFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        exeFlags += cmp0065Flags;
        exeFlags += " ";
      }

      cmValue targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        exeFlags += *targetLinkFlags;
        exeFlags += " ";
      }
      if (!configUpper.empty()) {
        targetLinkFlags =
          target->GetProperty(cmStrCat("LINK_FLAGS_", configUpper));
        if (targetLinkFlags) {
          exeFlags += *targetLinkFlags;
          exeFlags += " ";
        }
      }

      if (!exeFlags.empty()) {
        linkFlags.emplace_back(std::move(exeFlags));
      }

      std::vector<BT<std::string>> linkOpts =
        target->GetLinkOptions(config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, linkOpts);
    } break;
    default:
      break;
  }

  std::string extraLinkFlags;
  this->AppendPositionIndependentLinkerFlags(extraLinkFlags, target, config,
                                             linkLanguage);
  this->AppendIPOLinkerFlags(extraLinkFlags, target, config, linkLanguage);
  this->AppendModuleDefinitionFlag(extraLinkFlags, target, linkLineComputer,
                                   config);

  if (!extraLinkFlags.empty()) {
    linkFlags.emplace_back(std::move(extraLinkFlags));
  }
}